

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

ch_table_entry * find_entry(ch_table_entry *entries,uint32_t capacity,ch_string *key)

{
  ch_table_entry *local_48;
  ch_table_entry *entry;
  ch_table_entry *tombstone;
  uint32_t index;
  ch_string *key_local;
  uint32_t capacity_local;
  ch_table_entry *entries_local;
  
  tombstone._4_4_ = key->hash & capacity - 1;
  entry = (ch_table_entry *)0x0;
  do {
    local_48 = entries + tombstone._4_4_;
    if (local_48->key == (ch_string *)0x0) {
      if ((local_48->value).type == PRIMITIVE_NULL) {
        if (entry != (ch_table_entry *)0x0) {
          local_48 = entry;
        }
        return local_48;
      }
      if (entry == (ch_table_entry *)0x0) {
        entry = local_48;
      }
    }
    else if (local_48->key == key) {
      return local_48;
    }
    tombstone._4_4_ = tombstone._4_4_ + 1 & capacity - 1;
  } while( true );
}

Assistant:

static ch_table_entry *find_entry(ch_table_entry *entries, uint32_t capacity,
                                  ch_string *key) {
  uint32_t index = key->hash & (capacity - 1);
  ch_table_entry *tombstone = NULL;
  for (;;) {
    ch_table_entry *entry = &entries[index];
    if (entry->key == NULL) {
      if (IS_NULL(entry->value)) {
        return tombstone != NULL ? tombstone : entry;
      } else {
        if (tombstone == NULL)
          tombstone = entry;
      }
    } else if (entry->key == key) {
      return entry;
    }

    index = (index + 1) & (capacity - 1);
  }
}